

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O0

void __thiscall
EncoderMD::EmitRexByte
          (EncoderMD *this,BYTE *prexByte,BYTE rexByte,bool skipRexByte,bool reservedRexByte)

{
  List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  EncodeRelocAndLabels *lastRelocEntry_1;
  BYTE *current_1;
  EncodeRelocAndLabels *lastRelocEntry;
  BYTE *current;
  bool reservedRexByte_local;
  bool skipRexByte_local;
  BYTE rexByte_local;
  BYTE *prexByte_local;
  EncoderMD *this_local;
  
  current._7_1_ = rexByte;
  if (skipRexByte) {
    if ((rexByte & 0xf) == 8) {
      if (!reservedRexByte) {
        return;
      }
      lastRelocEntry = (EncodeRelocAndLabels *)prexByte;
      if (this->m_pc <= prexByte) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x57a,"(m_pc > prexByte)","m_pc > prexByte");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      for (; lastRelocEntry < (EncodeRelocAndLabels *)this->m_pc;
          lastRelocEntry = (EncodeRelocAndLabels *)((long)&lastRelocEntry->m_type + 1)) {
        *(byte *)&lastRelocEntry->m_type = *(byte *)((long)&lastRelocEntry->m_type + 1);
      }
      if (this->m_relocList == (RelocList *)0x0) {
        return;
      }
      pLVar1 = this->m_relocList;
      iVar4 = JsUtil::ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>::
              Count(&this->m_relocList->
                     super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                   );
      pTVar6 = JsUtil::
               List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar1,iVar4 + -1);
      if (pTVar6->m_ptr <= prexByte) {
        return;
      }
      if (this->m_pc <= pTVar6->m_ptr) {
        return;
      }
      if (pTVar6->m_type == RelocTypeLabel) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x588,"(lastRelocEntry.m_type != RelocTypeLabel)",
                           "lastRelocEntry.m_type != RelocTypeLabel");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pTVar6->m_ptr = (void *)((long)pTVar6->m_ptr + -1);
      pTVar6->m_origPtr = (void *)((long)pTVar6->m_origPtr + -1);
      return;
    }
    current._7_1_ = rexByte & 0xf7;
  }
  if (!reservedRexByte) {
    if (this->m_pc <= prexByte) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x598,"(m_pc > prexByte)","m_pc > prexByte");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    for (lastRelocEntry_1 = (EncodeRelocAndLabels *)this->m_pc; prexByte < lastRelocEntry_1;
        lastRelocEntry_1 = (EncodeRelocAndLabels *)&lastRelocEntry_1[-1].field_0x27) {
      *(undefined1 *)&lastRelocEntry_1->m_type = lastRelocEntry_1[-1].field_0x27;
    }
    if (this->m_relocList != (RelocList *)0x0) {
      pLVar1 = this->m_relocList;
      iVar4 = JsUtil::ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>::
              Count(&this->m_relocList->
                     super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                   );
      pTVar6 = JsUtil::
               List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar1,iVar4 + -1);
      if ((prexByte < pTVar6->m_ptr) && (pTVar6->m_ptr < this->m_pc)) {
        if (pTVar6->m_type == RelocTypeLabel) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                             ,0x5a6,"(lastRelocEntry.m_type != RelocTypeLabel)",
                             "lastRelocEntry.m_type != RelocTypeLabel");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pTVar6->m_ptr = (void *)((long)pTVar6->m_ptr + 1);
        pTVar6->m_origPtr = (void *)((long)pTVar6->m_origPtr + 1);
      }
    }
    this->m_pc = this->m_pc + 1;
  }
  *prexByte = current._7_1_;
  return;
}

Assistant:

void
EncoderMD::EmitRexByte(BYTE * prexByte, BYTE rexByte, bool skipRexByte, bool reservedRexByte)
{
    if (skipRexByte)
    {
        // REX byte is not needed - let's remove it and move everything else by 1 byte
        if (((rexByte)& 0x0F) == 0x8)
        {
            // If we didn't reserve the rex byte, we don't have to do anything
            if (reservedRexByte)
            {
                Assert(m_pc > prexByte);
                BYTE* current = prexByte;
                while (current < m_pc)
                {
                    *current = *(current + 1);
                    current++;
                }

                if (m_relocList != nullptr)
                {
                    // if a reloc record was added as part of encoding this instruction - fix the pc in the reloc
                    EncodeRelocAndLabels &lastRelocEntry = m_relocList->Item(m_relocList->Count() - 1);
                    if (lastRelocEntry.m_ptr > prexByte && lastRelocEntry.m_ptr < m_pc)
                    {
                        Assert(lastRelocEntry.m_type != RelocTypeLabel);
                        lastRelocEntry.m_ptr = (BYTE*)lastRelocEntry.m_ptr - 1;
                        lastRelocEntry.m_origPtr = (BYTE*)lastRelocEntry.m_origPtr - 1;
                    }
                }
            }
            return;
        }

        rexByte = rexByte & 0xF7;
    }

    // If we didn't reserve the rex byte, we need to move everything by 1 and make
    // room for it.
    if (!reservedRexByte)
    {
        Assert(m_pc > prexByte);
        BYTE* current = m_pc;
        while (current > prexByte)
        {
            *current = *(current - 1);
            current--;
        }

        if (m_relocList != nullptr)
        {
            // if a reloc record was added as part of encoding this instruction - fix the pc in the reloc
            EncodeRelocAndLabels &lastRelocEntry = m_relocList->Item(m_relocList->Count() - 1);
            if (lastRelocEntry.m_ptr > prexByte && lastRelocEntry.m_ptr < m_pc)
            {
                Assert(lastRelocEntry.m_type != RelocTypeLabel);
                lastRelocEntry.m_ptr = (BYTE*)lastRelocEntry.m_ptr + 1;
                lastRelocEntry.m_origPtr = (BYTE*)lastRelocEntry.m_origPtr + 1;
            }
        }
        m_pc++;
    }

    // Emit the rex byte
    *prexByte = rexByte;
}